

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O3

uint __thiscall ExecutorRegVm::GetCallStackAddress(ExecutorRegVm *this,uint frame)

{
  RegVmCmd *pRVar1;
  RegVmCmd *pRVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (frame < (this->callStack).count) {
    pRVar1 = (this->breakCode).data;
    pRVar2 = (this->callStack).data[frame];
    if ((pRVar2 < pRVar1) || (pRVar1 + (this->breakCode).count <= pRVar2)) {
      return (uint)((ulong)((long)pRVar2 - (long)this->codeBase) >> 3);
    }
    if (pRVar2->code != '\0') {
      __assert_fail("instruction->code == rviNop",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x6dd,"unsigned int ExecutorRegVm::GetCallStackAddress(unsigned int)");
    }
    uVar3 = pRVar2->argument;
  }
  return uVar3;
}

Assistant:

unsigned ExecutorRegVm::GetCallStackAddress(unsigned frame)
{
	if(frame >= callStack.size())
		return 0;

	RegVmCmd *instruction = callStack[frame];

	if(instruction >= breakCode.data && instruction < breakCode.data + breakCode.count)
	{
		assert(instruction->code == rviNop);

		return instruction->argument;
	}

	return unsigned(instruction - codeBase);
}